

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_wally_util.cpp
# Opt level: O0

bool cfd::core::WallyUtil::CheckValidMnemonic
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *mnemonic,string *language)

{
  undefined8 w;
  int iVar1;
  char *mnemonic_00;
  int ret;
  allocator local_69;
  string local_68 [32];
  StringUtil local_48 [8];
  string mnemonic_sentence;
  words *wally_wordlist;
  string *language_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *mnemonic_local;
  
  mnemonic_sentence.field_2._8_8_ = Bip39GetWordlist(language);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_68," ",&local_69);
  StringUtil::Join(local_48,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)mnemonic,(string *)local_68);
  ::std::__cxx11::string::~string(local_68);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_69);
  w = mnemonic_sentence.field_2._8_8_;
  mnemonic_00 = (char *)::std::__cxx11::string::c_str();
  iVar1 = bip39_mnemonic_validate((words *)w,mnemonic_00);
  ::std::__cxx11::string::~string((string *)local_48);
  return iVar1 == 0;
}

Assistant:

bool WallyUtil::CheckValidMnemonic(
    const std::vector<std::string>& mnemonic, const std::string& language) {
  words* wally_wordlist = Bip39GetWordlist(language);
  std::string mnemonic_sentence =
      StringUtil::Join(mnemonic, kMnemonicDelimiter);

  int ret = bip39_mnemonic_validate(wally_wordlist, mnemonic_sentence.c_str());
  if (ret != WALLY_OK) return false;
  return true;
}